

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::render_attributes_and_includes(t_rs_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_program *ptVar3;
  t_program *this_00;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  pointer pptVar6;
  t_rs_generator *this_01;
  pointer pptVar7;
  string module_namespace;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  string module_name;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  referenced_modules;
  string local_150;
  string local_130;
  vector<t_service_*,_std::allocator<t_service_*>_> local_110;
  vector<t_program_*,_std::allocator<t_program_*>_> local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_a0 [32];
  string local_80;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  size_t local_38;
  
  poVar1 = &this->f_gen_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"#![allow(unused_imports)]",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"#![allow(unused_extern_crates)]",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]",0x4f)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"#![cfg_attr(rustfmt, rustfmt_skip)]",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::cell::RefCell;",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::collections::{BTreeMap, BTreeSet};",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::convert::{From, TryFrom};",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::default::Default;",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::error::Error;",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"use std::fmt;",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use std::fmt::{Display, Formatter};",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"use std::rc::Rc;",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::OrderedFloat;",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};"
             ,0xb7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::protocol::field_id;",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::protocol::verify_expected_message_type;",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::protocol::verify_expected_sequence_number;",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::protocol::verify_expected_service_call;",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::protocol::verify_required_field_exists;",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"use thrift::server::TProcessor;",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (_Base_ptr)0x0;
  local_38 = 0;
  local_40._M_p = (pointer)local_60._24_8_;
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            (&local_f8,&((this->super_t_generator).program_)->includes_);
  if (local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar6 = local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      ptVar3 = *pptVar6;
      this_00 = *pptVar6;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"rs","");
      t_program::get_namespace(&local_150,this_00,&local_80);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_e0,&ptVar3->name_,&local_150);
      std::
      _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)local_60,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
        operator_delete(local_e0.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
        operator_delete(local_e0.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            (&local_110,&((this->super_t_generator).program_)->services_);
  if (local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      compute_service_referenced_modules
                (this,*pptVar7,
                 (set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_60);
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_38 != 0) {
    if ((_Rb_tree_node_base *)local_60._24_8_ != (_Rb_tree_node_base *)(local_60 + 8)) {
      paVar2 = &local_130.field_2;
      p_Var5 = (_Rb_tree_node_base *)local_60._24_8_;
      do {
        local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,*(long *)(p_Var5 + 1),
                   (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,*(long *)(p_Var5 + 2),
                   (long)&(p_Var5[2]._M_parent)->_M_color + *(long *)(p_Var5 + 2));
        local_130._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".","");
        local_a0._0_8_ = local_a0 + 0x10;
        this_01 = (t_rs_generator *)local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"::","");
        string_replace(this_01,&local_150,&local_130,(string *)local_a0);
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if (local_150._M_string_length == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"use crate::",0xb);
          rust_snake_case(&local_130,this,&local_e0.first);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_130._M_dataplus._M_p,
                              local_130._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"use crate::",0xb);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_150._M_dataplus._M_p,
                              local_150._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::",2);
          rust_snake_case(&local_130,this,&local_e0.first);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)(local_60 + 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  if (local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_60);
  return;
}

Assistant:

void t_rs_generator::render_attributes_and_includes() {
  // turn off some compiler/clippy warnings

  // code always includes BTreeMap/BTreeSet/OrderedFloat
  f_gen_ << "#![allow(unused_imports)]" << endl;
  // code might not include imports from crates
  f_gen_ << "#![allow(unused_extern_crates)]" << endl;
  // constructors take *all* struct parameters, which can trigger the "too many arguments" warning
  // some auto-gen'd types can be deeply nested. clippy recommends factoring them out which is hard to autogen
  // FIXME: re-enable the 'vec_box' lint see: [THRIFT-5364](https://issues.apache.org/jira/browse/THRIFT-5364)
  // This can happen because we automatically generate a Vec<Box<Type>> when the type is a typedef
  // and it's a forward typedef. This (typedef + forward typedef) can happen in two situations:
  // 1. When the type is recursive
  // 2. When you define types out of order
  f_gen_ << "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]" << endl;
  // prevent rustfmt from running against this file
  // lines are too long, code is (thankfully!) not visual-indented, etc.
  // can't use #[rustfmt::skip] see: https://github.com/rust-lang/rust/issues/54726
  f_gen_ << "#![cfg_attr(rustfmt, rustfmt_skip)]" << endl;
  f_gen_ << endl;

  // add standard includes
  f_gen_ << "use std::cell::RefCell;" << endl;
  f_gen_ << "use std::collections::{BTreeMap, BTreeSet};" << endl;
  f_gen_ << "use std::convert::{From, TryFrom};" << endl;
  f_gen_ << "use std::default::Default;" << endl;
  f_gen_ << "use std::error::Error;" << endl;
  f_gen_ << "use std::fmt;" << endl;
  f_gen_ << "use std::fmt::{Display, Formatter};" << endl;
  f_gen_ << "use std::rc::Rc;" << endl;
  f_gen_ << endl;
  f_gen_ << "use thrift::OrderedFloat;" << endl;
  f_gen_ << "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};" << endl;
  f_gen_ << "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};" << endl;
  f_gen_ << "use thrift::protocol::field_id;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_message_type;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_sequence_number;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_service_call;" << endl;
  f_gen_ << "use thrift::protocol::verify_required_field_exists;" << endl;
  f_gen_ << "use thrift::server::TProcessor;" << endl;
  f_gen_ << endl;

  // add all the program includes
  // NOTE: this is more involved than you would expect because of service extension
  // Basically, I have to find the closure of all the services and include their modules at the top-level

  set<pair<string, string>> referenced_modules; // set<module, namespace>

  // first, start by adding explicit thrift includes
  const vector<t_program*> includes = get_program()->get_includes();
  vector<t_program*>::const_iterator includes_iter;
  for(includes_iter = includes.begin(); includes_iter != includes.end(); ++includes_iter) {
    referenced_modules.insert(std::make_pair((*includes_iter)->get_name(), (*includes_iter)->get_namespace("rs")));
  }

  // next, recursively iterate through all the services and add the names of any programs they reference
  const vector<t_service*> services = get_program()->get_services();
  vector<t_service*>::const_iterator service_iter;
  for (service_iter = services.begin(); service_iter != services.end(); ++service_iter) {
    compute_service_referenced_modules(*service_iter, referenced_modules);
  }

  // finally, write all the "pub use..." declarations
  if (!referenced_modules.empty()) {
    set<pair<string, string>>::iterator module_iter;
    for (module_iter = referenced_modules.begin(); module_iter != referenced_modules.end(); ++module_iter) {
      string module_name((*module_iter).first);

      string module_namespace((*module_iter).second);
      string_replace(module_namespace, ".", "::");

      if (module_namespace.empty()) {
        f_gen_ << "use crate::" << rust_snake_case(module_name) << ";" << endl;
      } else {
        f_gen_ << "use crate::" << module_namespace << "::" << rust_snake_case(module_name) << ";" << endl;
      }
    }
    f_gen_ << endl;
  }
}